

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValidatorUtils-inl.hpp
# Opt level: O2

Result * CoreML::validateSchemaTypes
                   (Result *__return_storage_ptr__,
                   vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                   *allowedFeatureTypes,FeatureDescription *featureDesc)

{
  TypeCase TVar1;
  MLFeatureTypeType *pMVar2;
  bool bVar3;
  FeatureType *pFVar4;
  ostream *poVar5;
  char *pcVar6;
  pointer pTVar7;
  TypeCase *t;
  MLFeatureTypeType *pMVar8;
  vector<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
  *__range1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1d0;
  stringstream out;
  ostream local_1a0 [376];
  
  pFVar4 = featureDesc->type_;
  if (pFVar4 == (FeatureType *)0x0) {
    pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
  }
  pTVar7 = (allowedFeatureTypes->
           super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
           )._M_impl.super__Vector_impl_data._M_start;
  do {
    if (pTVar7 == (allowedFeatureTypes->
                  super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                  )._M_impl.super__Vector_impl_data._M_finish) {
      std::__cxx11::stringstream::stringstream((stringstream *)&out);
      poVar5 = std::operator<<(local_1a0,"Unsupported type \"");
      pFVar4 = featureDesc->type_;
      if (pFVar4 == (FeatureType *)0x0) {
        pFVar4 = (FeatureType *)&Specification::_FeatureType_default_instance_;
      }
      pcVar6 = ::MLFeatureTypeType_Name(pFVar4->_oneof_case_[0]);
      poVar5 = std::operator<<(poVar5,pcVar6);
      poVar5 = std::operator<<(poVar5,"\" for feature \"");
      std::operator+(&local_1d0,(featureDesc->name_).ptr_,"\". Should be one of: ");
      std::operator<<(poVar5,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      pMVar2 = (allowedFeatureTypes->
               super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
               )._M_impl.super__Vector_impl_data._M_finish;
      bVar3 = true;
      for (pMVar8 = (allowedFeatureTypes->
                    super__Vector_base<CoreML::Specification::FeatureType::TypeCase,_std::allocator<CoreML::Specification::FeatureType::TypeCase>_>
                    )._M_impl.super__Vector_impl_data._M_start; pMVar8 != pMVar2;
          pMVar8 = pMVar8 + 1) {
        if (!bVar3) {
          std::operator<<(local_1a0,", ");
        }
        pcVar6 = ::MLFeatureTypeType_Name(*pMVar8);
        std::operator<<(local_1a0,pcVar6);
        bVar3 = false;
      }
      poVar5 = std::operator<<(local_1a0,".");
      std::endl<char,std::char_traits<char>>(poVar5);
      std::__cxx11::stringbuf::str();
      Result::Result(__return_storage_ptr__,UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE,&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      std::__cxx11::stringstream::~stringstream((stringstream *)&out);
      return __return_storage_ptr__;
    }
    TVar1 = *pTVar7;
    pTVar7 = pTVar7 + 1;
  } while (pFVar4->_oneof_case_[0] != TVar1);
  Result::Result(__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline Result validateSchemaTypes(const std::vector<Specification::FeatureType::TypeCase>& allowedFeatureTypes,
                 const Specification::FeatureDescription& featureDesc) {
        
        // Check the types
        auto type = featureDesc.type().Type_case();
        for (const auto& t : allowedFeatureTypes) {
            if (type == t) {
                // no invariant broken -- type matches one of the allowed types
                return Result();
            }
        }
        
        // Invalid type
        std::stringstream out;
        out << "Unsupported type \"" << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(featureDesc.type().Type_case()))
        << "\" for feature \"" << featureDesc.name() + "\". Should be one of: ";
        bool isFirst = true;
        for (const auto& t: allowedFeatureTypes) {
            if (!isFirst) {
                out << ", ";
            }
            out << MLFeatureTypeType_Name(static_cast<MLFeatureTypeType>(t));
            isFirst = false;
        }
        out << "." << std::endl;
        return Result(ResultType::UNSUPPORTED_FEATURE_TYPE_FOR_MODEL_TYPE, out.str());
    }